

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O3

void Gia_ManQuantVerify(Gia_Man_t *p,int iObj)

{
  word *pwVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar3 = p->nSuppWords * iObj;
  if (((int)uVar3 < 0) || (p->vSuppWords->nSize <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                  ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
  }
  if ((-1 < iObj) && (iObj < p->nObjs)) {
    uVar5 = (uint)*(undefined8 *)(p->pObjs + (uint)iObj);
    if ((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) {
      if (0 < (p->vSuppVars).nSize) {
        pwVar1 = p->vSuppWords->pArray;
        uVar7 = 0;
        do {
          uVar5 = (p->vSuppVars).pArray[uVar7];
          Gia_ManIncrementTravId(p);
          uVar8 = uVar7 >> 6 & 0x3ffffff;
          uVar2 = pwVar1[uVar3 + uVar8];
          uVar6 = (uint)uVar7 & 0x3f;
          uVar4 = Gia_ManQuantVerify_rec(p,iObj,uVar5);
          if (((uVar2 >> uVar6 & 1) != 0) != uVar4) {
            printf("Mismatch at node %d related to CI %d (%d).\n",(ulong)(uint)iObj,(ulong)uVar5,
                   (ulong)((pwVar1[uVar3 + uVar8] >> uVar6 & 1) != 0));
          }
          uVar7 = uVar7 + 1;
        } while ((long)uVar7 < (long)(p->vSuppVars).nSize);
      }
      return;
    }
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                  ,0x59,"void Gia_ManQuantVerify(Gia_Man_t *, int)");
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManQuantVerify( Gia_Man_t * p, int iObj )
{
    word * pInfo = Gia_ManQuantInfoId( p, iObj );  int i, CiId;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
    {
        Gia_ManIncrementTravId( p );
        if ( Abc_TtGetBit(pInfo, i) != Gia_ManQuantVerify_rec(p, iObj, CiId) )
            printf( "Mismatch at node %d related to CI %d (%d).\n", iObj, CiId, Abc_TtGetBit(pInfo, i) );
    }
}